

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeModuleBuildLogGetString
          (ze_module_build_log_handle_t hModuleBuildLog,size_t *pSize,char *pBuildLog)

{
  ze_pfnModuleBuildLogGetString_t pfnGetString;
  dditable_t *dditable;
  ze_result_t result;
  char *pBuildLog_local;
  size_t *pSize_local;
  ze_module_build_log_handle_t hModuleBuildLog_local;
  
  if (*(code **)(*(long *)(hModuleBuildLog + 8) + 0x548) == (code *)0x0) {
    hModuleBuildLog_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hModuleBuildLog_local._4_4_ =
         (**(code **)(*(long *)(hModuleBuildLog + 8) + 0x548))
                   (*(undefined8 *)hModuleBuildLog,pSize,pBuildLog);
  }
  return hModuleBuildLog_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleBuildLogGetString(
        ze_module_build_log_handle_t hModuleBuildLog,   ///< [in] handle of the module build log object.
        size_t* pSize,                                  ///< [in,out] size of build log string.
        char* pBuildLog                                 ///< [in,out][optional] pointer to null-terminated string of the log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_build_log_object_t*>( hModuleBuildLog )->dditable;
        auto pfnGetString = dditable->ze.ModuleBuildLog.pfnGetString;
        if( nullptr == pfnGetString )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModuleBuildLog = reinterpret_cast<ze_module_build_log_object_t*>( hModuleBuildLog )->handle;

        // forward to device-driver
        result = pfnGetString( hModuleBuildLog, pSize, pBuildLog );

        return result;
    }